

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompileType<unsigned_short>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_e;
  Foo local_c;
  
  local_c = Foo1;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<Foo>
            (&local_e,&local_c);
  local_10.m_int = 0;
  CompiledMixedType<unsigned_short,char>();
  CompiledMixedType<unsigned_short,signed_char>();
  CompiledMixedType<unsigned_short,unsigned_char>();
  CompiledMixedType<unsigned_short,short>();
  CompiledMixedType<unsigned_short,unsigned_short>();
  CompiledMixedType<unsigned_short,int>();
  CompiledMixedType<unsigned_short,unsigned_int>();
  CompiledMixedType<unsigned_short,long>();
  CompiledMixedType<unsigned_short,unsigned_long>();
  CompiledMixedType<unsigned_short,long_long>();
  CompiledMixedType<unsigned_short,unsigned_long_long>();
  ModulusFriendTest<unsigned_short,char>();
  ModulusFriendTest<unsigned_short,signed_char>();
  ModulusFriendTest<unsigned_short,unsigned_char>();
  ModulusFriendTest<unsigned_short,short>();
  ModulusFriendTest<unsigned_short,unsigned_short>();
  ModulusFriendTest<unsigned_short,int>();
  ModulusFriendTest<unsigned_short,unsigned_int>();
  ModulusFriendTest<unsigned_short,long>();
  ModulusFriendTest<unsigned_short,unsigned_long>();
  ModulusFriendTest<unsigned_short,long_long>();
  ModulusFriendTest<unsigned_short,unsigned_long_long>();
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
            (&local_10,0);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
            (&local_10);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
            (&local_10,0);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
            (&local_10);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}